

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

int ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                 void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                 float scale_max,ImVec2 frame_size)

{
  float fVar1;
  ImVec2 IVar2;
  ImGuiWindow *this;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  ImU32 IVar7;
  ImGuiContext *pIVar8;
  ImVec2 p_max;
  bool bVar9;
  ImGuiID id;
  ImU32 IVar10;
  ImGuiContext *g;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar18 [16];
  float fVar16;
  float fVar17;
  undefined1 auVar19 [16];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 extraout_var_00 [56];
  undefined1 auVar20 [64];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar21;
  undefined8 in_XMM2_Qb;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  ImVec2 pos1;
  ImVec2 pos0;
  ImRect frame_bb;
  ImRect total_bb;
  undefined8 local_148;
  ImVec2 local_108;
  ImU32 local_fc;
  undefined1 local_f8 [16];
  ImVec2 local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  ImRect local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  char *local_78;
  ImGuiWindow *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImRect local_40;
  undefined1 extraout_var [60];
  
  pIVar8 = GImGui;
  local_88._4_4_ = in_XMM0_Db;
  local_88._0_4_ = scale_min;
  local_88._8_4_ = in_XMM0_Dc;
  local_88._12_4_ = in_XMM0_Dd;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return -1;
  }
  local_c8._4_4_ = in_XMM1_Db;
  local_c8._0_4_ = scale_max;
  local_c8._8_4_ = in_XMM1_Dc;
  local_c8._12_4_ = in_XMM1_Dd;
  local_f8._8_8_ = in_XMM2_Qb;
  local_f8._0_8_ = frame_size;
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  auVar22._0_8_ = CalcTextSize(label,(char *)0x0,true,-1.0);
  auVar22._8_56_ = extraout_var_00;
  local_68 = auVar22._0_16_;
  if ((local_f8._0_4_ == 0.0) && (!NAN(local_f8._0_4_))) {
    fVar15 = CalcItemWidth();
    local_f8._4_12_ = local_f8._4_12_;
    local_f8._0_4_ = fVar15;
  }
  auVar19 = vmovshdup_avx(local_f8);
  if ((auVar19._0_4_ != 0.0) || (NAN(auVar19._0_4_))) {
    fVar15 = (pIVar8->Style).FramePadding.y;
  }
  else {
    fVar15 = (pIVar8->Style).FramePadding.y;
    auVar19 = vmovshdup_avx(local_68);
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar15),ZEXT416(0x40000000));
    local_f8 = vinsertps_avx(local_f8,auVar19,0x10);
  }
  IVar2 = (this->DC).CursorPos;
  local_d8._8_8_ = 0;
  local_d8._0_4_ = IVar2.x;
  local_d8._4_4_ = IVar2.y;
  auVar19 = vinsertps_avx(local_f8,auVar19,0x10);
  local_98._0_4_ = auVar19._0_4_ + IVar2.x;
  local_98._4_4_ = auVar19._4_4_ + IVar2.y;
  local_98._8_4_ = auVar19._8_4_ + 0.0;
  local_98._12_4_ = auVar19._12_4_ + 0.0;
  local_a8 = (ImRect)vmovlhps_avx(local_d8,local_98);
  fVar16 = 0.0;
  if (0.0 < local_68._0_4_) {
    fVar16 = local_68._0_4_ + (pIVar8->Style).ItemInnerSpacing.x;
  }
  fVar1 = (pIVar8->Style).FramePadding.x;
  auVar19._0_4_ = (float)local_98._0_4_ + fVar16;
  auVar19._4_4_ = local_98._4_4_ + 0.0;
  auVar19._8_4_ = local_98._8_4_ + 0.0;
  auVar19._12_4_ = local_98._12_4_ + 0.0;
  local_40 = (ImRect)vmovlhps_avx(local_d8,auVar19);
  local_70 = this;
  ItemSize(&local_40,fVar15);
  bVar9 = ItemAdd(&local_40,0,&local_a8,0);
  if (!bVar9) {
    return -1;
  }
  local_b8 = vmovshdup_avx(local_d8);
  bVar9 = ItemHoverable(&local_a8,id);
  if ((((float)local_88._0_4_ == 3.4028235e+38) && (!NAN((float)local_88._0_4_))) ||
     (((float)local_c8._0_4_ == 3.4028235e+38 && (!NAN((float)local_c8._0_4_))))) {
    iVar13 = 0x7f7fffff;
    if (values_count < 1) {
      iVar12 = -0x800001;
    }
    else {
      auVar23 = ZEXT464(0xff7fffff);
      auVar22 = ZEXT464(0x7f7fffff);
      iVar11 = 0;
      do {
        auVar20._0_4_ = (*values_getter)(data,iVar11);
        auVar20._4_60_ = extraout_var;
        bVar3 = NAN(auVar20._0_4_);
        iVar11 = iVar11 + 1;
        uVar4 = vcmpss_avx512f(auVar20._0_16_,auVar23._0_16_,2);
        bVar6 = (bool)((byte)uVar4 & 1);
        auVar19 = vminss_avx(auVar22._0_16_,auVar20._0_16_);
        iVar12 = (uint)bVar3 * auVar23._0_4_ +
                 (uint)!bVar3 * ((uint)bVar6 * auVar23._0_4_ + (uint)!bVar6 * (int)auVar20._0_4_);
        iVar13 = (uint)bVar3 * auVar22._0_4_ + (uint)!bVar3 * auVar19._0_4_;
        auVar23 = ZEXT1664(CONCAT124(extraout_var._0_12_,iVar12));
        auVar22 = ZEXT1664(CONCAT124(auVar19._4_12_,iVar13));
      } while (values_count != iVar11);
    }
    uVar4 = vcmpss_avx512f(local_88,SUB6416(ZEXT464(0x7f7fffff),0),0);
    bVar3 = (bool)((byte)uVar4 & 1);
    local_88._0_4_ = (uint)bVar3 * iVar13 + (uint)!bVar3 * local_88._0_4_;
    uVar4 = vcmpss_avx512f(local_c8,SUB6416(ZEXT464(0x7f7fffff),0),0);
    bVar3 = (bool)((byte)uVar4 & 1);
    local_c8._0_4_ = (uint)bVar3 * iVar12 + (uint)!bVar3 * local_c8._0_4_;
  }
  local_b8 = ZEXT416((uint)(fVar15 + (float)local_b8._0_4_));
  IVar2 = local_a8.Min;
  p_max = local_a8.Max;
  IVar10 = GetColorU32(7,1.0);
  RenderFrame(IVar2,p_max,IVar10,true,(pIVar8->Style).FrameRounding);
  local_148._0_4_ = -1;
  if (values_count < (int)((plot_type == ImGuiPlotType_Lines) + 1)) goto LAB_002f6819;
  iVar13 = (int)(float)local_f8._0_4_;
  fVar16 = fVar1 + (float)local_d8._0_4_;
  auVar19 = vmovshdup_avx(local_98);
  fVar1 = local_98._0_4_ - fVar1;
  fVar15 = auVar19._0_4_ - fVar15;
  local_f8._0_4_ = fVar16;
  if (values_count <= iVar13) {
    iVar13 = values_count;
  }
  iVar12 = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
  iVar13 = iVar13 - (uint)(plot_type == ImGuiPlotType_Lines);
  local_148 = 0xffffffff;
  local_148._0_4_ = -1;
  local_98._0_4_ = fVar15;
  local_78 = label;
  if (bVar9) {
    fVar17 = (pIVar8->IO).MousePos.x;
    if (fVar16 <= fVar17) {
      fVar21 = (pIVar8->IO).MousePos.y;
      if ((((float)local_b8._0_4_ <= fVar21) && (fVar17 < fVar1)) && (fVar21 < fVar15)) {
        auVar14._0_12_ = ZEXT812(0);
        auVar14._12_4_ = 0;
        auVar18._0_4_ = (fVar17 - fVar16) / (fVar1 - fVar16);
        auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar19 = vminss_avx(SUB6416(ZEXT464(0x3f7ff972),0),auVar18);
        uVar4 = vcmpss_avx512f(auVar18,auVar14,1);
        iVar11 = (int)((float)((uint)!(bool)((byte)uVar4 & 1) * auVar19._0_4_) * (float)iVar12);
        local_148 = CONCAT44((int)((ulong)overlay_text >> 0x20),iVar11);
        fVar15 = (*values_getter)(data,(iVar11 + values_offset) % values_count);
        fVar16 = (*values_getter)(data,(iVar11 + 1 + values_offset) % values_count);
        if (plot_type == ImGuiPlotType_Lines) {
          SetTooltip("%d: %8.4g\n%d: %8.4g",(double)fVar15,(double)fVar16,iVar11,(ulong)(iVar11 + 1)
                    );
        }
        else if (plot_type == ImGuiPlotType_Histogram) {
          SetTooltip("%d: %8.4g",(double)fVar15,local_148);
        }
        goto LAB_002f64ff;
      }
    }
  }
  else {
LAB_002f64ff:
  }
  bVar9 = plot_type != ImGuiPlotType_Lines;
  fVar15 = (*values_getter)(data,values_offset % values_count);
  local_d8._0_4_ = fVar15;
  IVar10 = GetColorU32(bVar9 + 0x26 + (uint)bVar9,1.0);
  local_fc = GetColorU32(bVar9 + 0x27 + (uint)bVar9,1.0);
  label = local_78;
  if (0 < iVar13) {
    fVar16 = (float)iVar13;
    auVar24 = ZEXT816(0) << 0x40;
    uVar4 = vcmpss_avx512f(local_88,local_c8,0);
    fVar17 = local_c8._0_4_;
    fVar21 = local_88._0_4_;
    fVar15 = (float)((uint)!(bool)((byte)uVar4 & 1) * (int)(1.0 / (fVar17 - fVar21)));
    local_c8 = ZEXT416((uint)fVar15);
    uVar4 = vcmpss_avx512f(local_88,auVar24,1);
    auVar18 = vfmadd213ss_fma(local_c8,local_88,SUB6416(ZEXT464(0x3f800000),0));
    uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar17 * fVar21)),auVar24,1);
    bVar9 = (bool)((byte)uVar5 & 1);
    auVar14 = ZEXT416((uint)(fVar15 * ((float)local_d8._0_4_ - fVar21)));
    auVar19 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
    uVar5 = vcmpss_avx512f(auVar14,auVar24,1);
    bVar3 = (bool)((byte)uVar5 & 1);
    auVar22 = ZEXT464((uint)bVar3 * 0x3f800000 + (uint)!bVar3 * (int)(1.0 - auVar19._0_4_));
    auVar23 = ZEXT864(0);
    local_d8._0_4_ = (float)iVar12;
    fVar1 = fVar1 - (float)local_f8._0_4_;
    fVar15 = (float)local_98._0_4_ - local_b8._0_4_;
    local_58 = vfmadd213ss_fma(ZEXT416((uint)bVar9 * auVar18._0_4_ +
                                       (uint)!bVar9 * (uint)!(bool)((byte)uVar4 & 1) * 0x3f800000),
                               ZEXT416((uint)fVar15),local_b8);
    local_98._0_4_ = fVar15;
    do {
      auVar18 = auVar23._0_16_;
      auVar19 = vfmadd213ss_fma(ZEXT416((uint)local_d8._0_4_),auVar18,ZEXT416(0x3f000000));
      iVar12 = (int)auVar19._0_4_;
      fVar17 = (*values_getter)(data,(values_offset + 1 + iVar12) % values_count);
      fVar15 = auVar23._0_4_ + 1.0 / fVar16;
      auVar23 = ZEXT464((uint)fVar15);
      auVar19 = ZEXT416((uint)((fVar17 - (float)local_88._0_4_) * (float)local_c8._0_4_));
      uVar4 = vcmpss_avx512f(auVar19,ZEXT416(0),1);
      bVar9 = (bool)((byte)uVar4 & 1);
      auVar19 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar19);
      auVar14 = ZEXT416((uint)bVar9 * 0x3f800000 + (uint)!bVar9 * (int)(1.0 - auVar19._0_4_));
      auVar18 = vfmadd213ss_fma(auVar18,ZEXT416((uint)fVar1),ZEXT416((uint)local_f8._0_4_));
      auVar19 = vfmadd213ss_fma(auVar22._0_16_,ZEXT416((uint)local_98._0_4_),local_b8);
      auVar19 = vinsertps_avx(auVar18,auVar19,0x10);
      local_e0 = (ImVec2)vmovlps_avx(auVar19);
      auVar19 = vfmadd213ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)fVar1),
                                ZEXT416((uint)local_f8._0_4_));
      if (plot_type == ImGuiPlotType_Lines) {
        auVar18 = vfmadd213ss_fma(auVar14,ZEXT416((uint)local_98._0_4_),local_b8);
        auVar19 = vinsertps_avx(auVar19,auVar18,0x10);
        local_108 = (ImVec2)vmovlps_avx(auVar19);
        IVar7 = IVar10;
        if ((int)local_148 == iVar12) {
          IVar7 = local_fc;
        }
        ImDrawList::AddLine(local_70->DrawList,&local_e0,&local_108,IVar7,1.0);
        auVar23 = ZEXT1664(ZEXT416((uint)fVar15));
      }
      else {
        auVar24 = vinsertps_avx(auVar19,ZEXT416((uint)local_58._0_4_),0x10);
        local_108 = (ImVec2)vmovlps_avx(auVar24);
        if (plot_type == ImGuiPlotType_Histogram) {
          if (auVar18._0_4_ + 2.0 <= auVar19._0_4_) {
            local_108.x = auVar19._0_4_ + -1.0;
          }
          IVar7 = IVar10;
          if ((int)local_148 == iVar12) {
            IVar7 = local_fc;
          }
          ImDrawList::AddRectFilled(local_70->DrawList,&local_e0,&local_108,IVar7,0.0,0);
          auVar23 = ZEXT464((uint)fVar15);
        }
      }
      auVar22 = ZEXT1664(auVar14);
      iVar13 = iVar13 + -1;
      label = local_78;
    } while (iVar13 != 0);
  }
LAB_002f6819:
  if (overlay_text != (char *)0x0) {
    local_e0.y = local_a8.Min.y + (pIVar8->Style).FramePadding.y;
    local_e0.x = local_a8.Min.x;
    local_108 = (ImVec2)vmovlps_avx(SUB6416(ZEXT464(0x3f000000),0));
    RenderTextClipped(&local_e0,&local_a8.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_108,
                      (ImRect *)0x0);
  }
  if (0.0 < (float)local_68._0_4_) {
    auVar19 = vinsertps_avx(ZEXT416((uint)(local_a8.Max.x + (pIVar8->Style).ItemInnerSpacing.x)),
                            ZEXT416((uint)local_b8._0_4_),0x10);
    RenderText(auVar19._0_8_,label,(char *)0x0,true);
  }
  return (int)local_148;
}

Assistant:

int ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return -1;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return -1;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    int idx_hovered = -1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx + 1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            idx_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (1 + scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f, 0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);

    // Return hovered index or -1 if none are hovered.
    // This is currently not exposed in the public API because we need a larger redesign of the whole thing, but in the short-term we are making it available in PlotEx().
    return idx_hovered;
}